

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testRNNLayer(void)

{
  ModelDescription *pMVar1;
  FeatureType *pFVar2;
  ostream *poVar3;
  Result local_a8;
  SimpleRecurrentLayerParams *params;
  NeuralNetworkLayer *layer;
  NeuralNetwork *nn;
  FeatureDescription *out;
  ArrayFeatureType *shape;
  FeatureDescription *local_48;
  FeatureDescription *topIn;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  local_48 = CoreML::Specification::ModelDescription::add_input(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(local_48,"A");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(local_48);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(local_48);
  out = (FeatureDescription *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out,1);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  nn = (NeuralNetwork *)CoreML::Specification::ModelDescription::add_output(pMVar1);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)nn,"B");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type((FeatureDescription *)nn);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  layer = (NeuralNetworkLayer *)CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn)
  ;
  params = (SimpleRecurrentLayerParams *)
           CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)layer);
  CoreML::Specification::NeuralNetworkLayer::set_name((NeuralNetworkLayer *)params,"rnn");
  CoreML::Specification::NeuralNetworkLayer::add_input((NeuralNetworkLayer *)params,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output((NeuralNetworkLayer *)params,"B");
  local_a8.m_message._M_storage._M_storage =
       (uchar  [8])
       CoreML::Specification::NeuralNetworkLayer::mutable_simplerecurrent
                 ((NeuralNetworkLayer *)params);
  CoreML::Specification::SimpleRecurrentLayerParams::set_hasbiasvector
            ((SimpleRecurrentLayerParams *)local_a8.m_message._M_storage._M_storage,false);
  CoreML::Specification::SimpleRecurrentLayerParams::set_sequenceoutput
            ((SimpleRecurrentLayerParams *)local_a8.m_message._M_storage._M_storage,false);
  CoreML::validate<(MLModelType)500>(&local_a8,(Model *)&topIn);
  m1._oneof_case_[0]._0_1_ = CoreML::Result::good(&local_a8);
  if (m1._oneof_case_[0]._0_1_) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x316);
    poVar3 = std::operator<<(poVar3,": error: ");
    poVar3 = std::operator<<(poVar3,"!((res).good())");
    poVar3 = std::operator<<(poVar3," was false, expected true.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  m1._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result(&local_a8);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m1._oneof_case_[0];
}

Assistant:

int testRNNLayer() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();

    auto *nn = m1.mutable_neuralnetwork();
    Specification::NeuralNetworkLayer *layer = nn->add_layers();
    layer->set_name("rnn");
    layer->add_input("A");
    layer->add_output("B");
    Specification::SimpleRecurrentLayerParams *params = layer->mutable_simplerecurrent();
    params->set_hasbiasvector(false);
    params->set_sequenceoutput(false);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);

    return 0;

}